

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_parser_test.cpp
# Opt level: O1

void __thiscall
bioparser::test::BioparserFastaTest_CompressedParseAndReset_Test::TestBody
          (BioparserFastaTest_CompressedParseAndReset_Test *this)

{
  Parser<biosoup::Sequence> *pPVar1;
  pointer puVar2;
  pointer puVar3;
  pointer this_00;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  t;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  local_70;
  string local_58;
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sample.fasta.gz","");
  BioparserFastaTest::Setup(&this->super_BioparserFastaTest,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_70,pPVar1,0xffffffffffffffff,1);
  local_58._M_dataplus._M_p =
       (pointer)(this->super_BioparserFastaTest).s.
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_string_length =
       (size_type)
       (this->super_BioparserFastaTest).s.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.field_2._M_allocated_capacity =
       (size_type)
       (this->super_BioparserFastaTest).s.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_BioparserFastaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_70.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_BioparserFastaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_70.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_BioparserFastaTest).s.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_70.
       super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.
  super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             *)&local_58);
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&local_70);
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  gzseek((pPVar1->file_)._M_t.super___uniq_ptr_impl<gzFile_s,_int_(*)(gzFile_s_*)>._M_t.
         super__Tuple_impl<0UL,_gzFile_s_*,_int_(*)(gzFile_s_*)>.
         super__Head_base<0UL,_gzFile_s_*,_false>._M_head_impl,0,0);
  pPVar1->buffer_ptr_ = 0;
  pPVar1->buffer_bytes_ = 0;
  puVar2 = (this->super_BioparserFastaTest).s.
           super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->super_BioparserFastaTest).s.
           super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = puVar2;
  if (puVar3 != puVar2) {
    do {
      std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>::~unique_ptr
                (this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar3);
    (this->super_BioparserFastaTest).s.
    super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  pPVar1 = (this->super_BioparserFastaTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
           .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_70,pPVar1,0x10000,1);
  if (local_70.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_70.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>
      ::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>*,std::vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>>>>
                ((vector<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>,std::allocator<std::unique_ptr<biosoup::Sequence,std::default_delete<biosoup::Sequence>>>>
                  *)&(this->super_BioparserFastaTest).s,
                 (this->super_BioparserFastaTest).s.
                 super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pPVar1 = (this->super_BioparserFastaTest).p._M_t.
               super___uniq_ptr_impl<bioparser::Parser<biosoup::Sequence>,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_bioparser::Parser<biosoup::Sequence>_*,_std::default_delete<bioparser::Parser<biosoup::Sequence>_>_>
               .super__Head_base<0UL,_bioparser::Parser<biosoup::Sequence>_*,_false>._M_head_impl;
      (*pPVar1->_vptr_Parser[2])(&local_38,pPVar1,0x10000,1);
      local_58.field_2._M_allocated_capacity =
           (size_type)
           local_70.
           super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58._M_string_length =
           (size_type)
           local_70.
           super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58._M_dataplus._M_p =
           (pointer)local_70.
                    super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_70.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_38.
           super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_70.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_38.
           super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_70.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_38.
           super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_38.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38.
      super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ::~vector((vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                 *)&local_58);
      std::
      vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
      ::~vector(&local_38);
    } while (local_70.
             super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_70.
             super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
  ::~vector(&local_70);
  BioparserFastaTest::Check(&this->super_BioparserFastaTest,true);
  return;
}

Assistant:

TEST_F(BioparserFastaTest, CompressedParseAndReset) {
  Setup("sample.fasta.gz");
  s = p->Parse(-1);
  p->Reset();
  s.clear();
  for (auto t = p->Parse(65536); !t.empty(); t = p->Parse(65536)) {
    s.insert(
        s.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}